

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void __thiscall testing::internal::AssertHelper::operator=(AssertHelper *this,Message *message)

{
  Type result_type;
  int line_number;
  AssertHelperData *pAVar1;
  char *file_name;
  int skip_count;
  UnitTestImpl *this_00;
  string local_60;
  string local_40;
  
  UnitTest::GetInstance();
  pAVar1 = this->data_;
  result_type = pAVar1->type;
  file_name = pAVar1->file;
  line_number = pAVar1->line;
  this_00 = (UnitTestImpl *)&pAVar1->message;
  AppendUserMessage(&local_40,(string *)this_00,message);
  UnitTest::GetInstance();
  UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_(&local_60,this_00,skip_count);
  UnitTest::AddTestPartResult
            (&UnitTest::GetInstance::instance,result_type,file_name,line_number,&local_40,&local_60)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AssertHelper::operator=(const Message& message) const {
  UnitTest::GetInstance()->
    AddTestPartResult(data_->type, data_->file, data_->line,
                      AppendUserMessage(data_->message, message),
                      UnitTest::GetInstance()->impl()
                      ->CurrentOsStackTraceExceptTop(1)
                      // Skips the stack frame for this function itself.
                      );  // NOLINT
}